

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O3

int get_eob_cost(int eob,LV_MAP_EOB_COST *txb_eob_costs,LV_MAP_COEFF_COST *txb_costs,
                TX_CLASS tx_class)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  long lVar3;
  int eob_extra;
  uint local_1c;
  
  iVar1 = av1_get_eob_pos_token(eob,(int *)&local_1c);
  lVar3 = (long)iVar1;
  iVar1 = txb_eob_costs->eob_cost[(ulong)((int)CONCAT71(in_register_00000009,tx_class) != 0) - 1]
          [lVar3 + 10];
  if (0 < av1_eob_offset_bits[lVar3]) {
    uVar2 = (int)av1_eob_offset_bits[lVar3] - 1;
    iVar1 = uVar2 * 0x200 + iVar1 +
            txb_costs->eob_extra_cost[lVar3 + -3][(local_1c >> (uVar2 & 0x1f) & 1) != 0];
  }
  return iVar1;
}

Assistant:

static int get_eob_cost(int eob, const LV_MAP_EOB_COST *txb_eob_costs,
                        const LV_MAP_COEFF_COST *txb_costs, TX_CLASS tx_class) {
  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  int eob_cost = 0;
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  eob_cost = txb_eob_costs->eob_cost[eob_multi_ctx][eob_pt - 1];

  if (av1_eob_offset_bits[eob_pt] > 0) {
    const int eob_ctx = eob_pt - 3;
    const int eob_shift = av1_eob_offset_bits[eob_pt] - 1;
    const int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    eob_cost += txb_costs->eob_extra_cost[eob_ctx][bit];
    const int offset_bits = av1_eob_offset_bits[eob_pt];
    if (offset_bits > 1) eob_cost += av1_cost_literal(offset_bits - 1);
  }
  return eob_cost;
}